

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O3

void __thiscall cmCTestSVN::CleanupImpl(cmCTestSVN *this)

{
  vector<const_char_*,_std::allocator<const_char_*>_> svn_cleanup;
  OutputLogger out;
  OutputLogger err;
  vector<const_char_*,_std::allocator<const_char_*>_> local_a8;
  OutputLogger local_88;
  OutputLogger local_48;
  
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_88.super_LineParser.super_OutputParser._vptr_OutputParser = (_func_int **)0x73ce24;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_a8,(char **)&local_88);
  cmProcessTools::OutputLogger::OutputLogger
            (&local_88,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"cleanup-out> ");
  cmProcessTools::OutputLogger::OutputLogger
            (&local_48,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,"cleanup-err> ");
  RunSVNCommand(this,&local_a8,(OutputParser *)&local_88,(OutputParser *)&local_48);
  local_48.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.super_LineParser.Line._M_dataplus._M_p != &local_48.super_LineParser.Line.field_2)
  {
    operator_delete(local_48.super_LineParser.Line._M_dataplus._M_p,
                    local_48.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  local_88.super_LineParser.super_OutputParser._vptr_OutputParser =
       (_func_int **)&PTR__LineParser_0094e948;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88.super_LineParser.Line._M_dataplus._M_p != &local_88.super_LineParser.Line.field_2)
  {
    operator_delete(local_88.super_LineParser.Line._M_dataplus._M_p,
                    local_88.super_LineParser.Line.field_2._M_allocated_capacity + 1);
  }
  if (local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void cmCTestSVN::CleanupImpl()
{
  std::vector<const char*> svn_cleanup;
  svn_cleanup.push_back("cleanup");
  OutputLogger out(this->Log, "cleanup-out> ");
  OutputLogger err(this->Log, "cleanup-err> ");
  this->RunSVNCommand(svn_cleanup, &out, &err);
}